

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O2

void AM_changeWindowLoc(void)

{
  undefined4 uVar1;
  undefined4 uVar2;
  double dVar3;
  double dVar4;
  AActor *pAVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  double local_28;
  double local_20;
  DAngle local_18;
  
  if ((((_ZL8m_paninc_0 != 0.0) || (NAN(_ZL8m_paninc_0))) || (_ZL8m_paninc_1 != 0.0)) ||
     (NAN(_ZL8m_paninc_1))) {
    FBoolCVar::operator=(&am_followplayer,false);
    _ZL8f_oldloc_0 = 0x47efffffe0000000;
  }
  dVar4 = m_y;
  dVar3 = m_x;
  uVar1 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
  uVar2 = (screen->super_DSimpleCanvas).super_DCanvas.Height;
  auVar10._0_8_ = (double)(int)uVar1 * _ZL8m_paninc_0;
  auVar10._8_8_ = (double)(int)uVar2 * _ZL8m_paninc_1;
  auVar11 = divpd(auVar10,_DAT_005b5550);
  dVar9 = auVar11._0_8_;
  dVar12 = auVar11._8_8_;
  local_28 = dVar12;
  local_20 = dVar9;
  if (am_rotate.Value == 1) {
LAB_003637ac:
    pAVar5 = GC::ReadBarrier<AActor>((AActor **)(&DAT_017dc0f8 + (long)consoleplayer * 0x54));
    local_18.Degrees = (pAVar5->Angles).Yaw.Degrees + -90.0;
    AM_rotate(&local_20,&local_28,&local_18);
    auVar11._8_8_ = local_28;
    auVar11._0_8_ = local_20;
LAB_00363857:
    m_x = auVar11._0_8_ + m_x;
    m_y = auVar11._8_8_ + m_y;
    dVar6 = m_h * 0.5;
    dVar7 = m_w * 0.5;
    if (am_rotate.Value != 0) {
      if (am_rotate.Value != 2) goto LAB_00363993;
      goto LAB_00363903;
    }
  }
  else {
    if (am_rotate.Value != 2) goto LAB_00363857;
    if (viewactive != false) goto LAB_003637ac;
    m_x = dVar9 + m_x;
    m_y = dVar12 + m_y;
    dVar6 = m_h * 0.5;
    dVar7 = m_w * 0.5;
LAB_00363903:
    if (viewactive != false) goto LAB_00363993;
  }
  dVar8 = max_x;
  if ((max_x < m_x + dVar7) || (dVar8 = min_x, m_x + dVar7 < min_x)) {
    m_x = dVar8 - dVar7;
  }
  dVar7 = max_y;
  if ((max_y < m_y + dVar6) || (dVar7 = min_y, m_y + dVar6 < min_y)) {
    m_y = dVar7 - dVar6;
  }
LAB_00363993:
  m_x2 = m_w + m_x;
  m_y2 = m_h + m_y;
  AM_ScrollParchment((double)(-(ulong)(dVar3 != m_x) & (ulong)dVar9),
                     (double)(-(ulong)(m_y != dVar4) & (ulong)-dVar12));
  return;
}

Assistant:

void AM_changeWindowLoc ()
{
	if (m_paninc.x || m_paninc.y)
	{
		am_followplayer = false;
		f_oldloc.x = FLT_MAX;
	}

	double oldmx = m_x, oldmy = m_y;
	double incx, incy, oincx, oincy;
	
	incx = m_paninc.x;
	incy = m_paninc.y;

	oincx = incx = m_paninc.x * SCREENWIDTH / 320;
	oincy = incy = m_paninc.y * SCREENHEIGHT / 200;
	if (am_rotate == 1 || (am_rotate == 2 && viewactive))
	{
		AM_rotate(&incx, &incy, players[consoleplayer].camera->Angles.Yaw - 90.);
	}

	m_x += incx;
	m_y += incy;

	AM_ClipRotatedExtents (oldmx + m_w/2, oldmy + m_h/2);
	AM_ScrollParchment (m_x != oldmx ? oincx : 0, m_y != oldmy ? -oincy : 0);
}